

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_isdir(char *args)

{
  char *pcVar1;
  size_t sVar2;
  uint local_3c;
  undefined1 local_38 [4];
  int rc;
  PHYSFS_Stat statbuf;
  char *args_local;
  
  statbuf._32_8_ = args;
  if (*args == '\"') {
    pcVar1 = args + 1;
    statbuf._32_8_ = pcVar1;
    sVar2 = strlen(pcVar1);
    pcVar1[sVar2 - 1] = '\0';
  }
  local_3c = PHYSFS_stat(statbuf._32_8_,local_38);
  if (local_3c != 0) {
    local_3c = (uint)((int)statbuf.accesstime == 1);
  }
  pcVar1 = "is NOT";
  if (local_3c != 0) {
    pcVar1 = "is";
  }
  printf("File %s a directory.\n",pcVar1);
  return 1;
}

Assistant:

static int cmd_isdir(char *args)
{
    PHYSFS_Stat statbuf;
    int rc;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    rc = PHYSFS_stat(args, &statbuf);
    if (rc)
        rc = (statbuf.filetype == PHYSFS_FILETYPE_DIRECTORY);
    printf("File %s a directory.\n", rc ? "is" : "is NOT");
    return 1;
}